

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

bool common_chat_verify_template(string *tmpl,bool use_jinja)

{
  int iVar1;
  undefined7 in_register_00000031;
  bool bVar2;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  common_chat_templates_ptr tmpls;
  common_chat_templates_inputs inputs;
  llama_chat_message chat [1];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  pointer local_208;
  pointer pcStack_200;
  pointer local_1f8;
  pointer pcStack_1f0;
  pointer local_1e8;
  pointer pcStack_1e0;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  common_chat_msg local_178;
  common_chat_params local_a8;
  
  if ((int)CONCAT71(in_register_00000031,use_jinja) == 0) {
    chat[0].role = "user";
    chat[0].content = "test";
    iVar1 = llama_chat_apply_template((tmpl->_M_dataplus)._M_p,chat,1,1,0,0);
    bVar2 = -1 < iVar1;
  }
  else {
    chat[0].role = (char *)&local_238;
    chat[0].content = (char *)0x0;
    local_238._M_local_buf[0] = '\0';
    local_228._M_p = (pointer)&local_218;
    local_220 = 0;
    local_218._M_local_buf[0] = '\0';
    local_1d8._M_p = (pointer)&local_1c8;
    local_208 = (pointer)0x0;
    pcStack_200 = (pointer)0x0;
    local_1f8 = (pointer)0x0;
    pcStack_1f0 = (pointer)0x0;
    local_1e8 = (pointer)0x0;
    pcStack_1e0 = (pointer)0x0;
    local_1d0 = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_1b8._M_p = (pointer)&local_1a8;
    local_1b0 = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198._M_p = (pointer)&local_188;
    local_190 = 0;
    local_188._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)chat);
    std::__cxx11::string::assign((char *)&local_228);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_2d1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&inputs,"",&local_2d2);
    common_chat_templates_init((llama_model *)&tmpls,(string *)0x0,tmpl,&local_178.role);
    std::__cxx11::string::~string((string *)&inputs);
    std::__cxx11::string::~string((string *)&local_178);
    inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    inputs.grammar._M_dataplus._M_p = (pointer)&inputs.grammar.field_2;
    inputs.grammar._M_string_length = 0;
    inputs.grammar.field_2._M_local_buf[0] = '\0';
    inputs.json_schema._M_dataplus._M_p = (pointer)&inputs.json_schema.field_2;
    inputs.json_schema._M_string_length = 0;
    inputs.json_schema.field_2._M_local_buf[0] = '\0';
    inputs.add_generation_prompt = true;
    inputs.use_jinja = true;
    inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
    super__Vector_impl_data._M_finish._0_5_ = 0;
    inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
    super__Vector_impl_data._M_finish._5_3_ = 0;
    inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
    inputs._117_8_ = 0;
    inputs.extract_reasoning = true;
    common_chat_msg::common_chat_msg(&local_178,(common_chat_msg *)chat);
    std::vector<common_chat_msg,std::allocator<common_chat_msg>>::
    _M_assign_aux<common_chat_msg_const*>
              ((vector<common_chat_msg,std::allocator<common_chat_msg>> *)&inputs,&local_178,
               &local_a8);
    common_chat_msg::~common_chat_msg(&local_178);
    common_chat_templates_apply
              (&local_a8,
               (common_chat_templates *)
               tmpls._M_t.
               super___uniq_ptr_impl<common_chat_templates,_common_chat_templates_deleter>._M_t.
               super__Tuple_impl<0UL,_common_chat_templates_*,_common_chat_templates_deleter>.
               super__Head_base<0UL,_common_chat_templates_*,_false>._M_head_impl,&inputs);
    common_chat_params::~common_chat_params(&local_a8);
    common_chat_templates_inputs::~common_chat_templates_inputs(&inputs);
    std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::~unique_ptr(&tmpls);
    common_chat_msg::~common_chat_msg((common_chat_msg *)chat);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool common_chat_verify_template(const std::string & tmpl, bool use_jinja) {
    if (use_jinja) {
        try {
            common_chat_msg msg;
            msg.role = "user";
            msg.content = "test";

            auto tmpls = common_chat_templates_init(/* model= */ nullptr, tmpl);

            common_chat_templates_inputs inputs;
            inputs.messages = {msg};

            common_chat_templates_apply(tmpls.get(), inputs);
            return true;
        } catch (const std::exception & e) {
            LOG_ERR("%s: failed to apply template: %s\n", __func__, e.what());
            return false;
        }
    }
    llama_chat_message chat[] = {{"user", "test"}};
    const int res = llama_chat_apply_template(tmpl.c_str(), chat, 1, true, nullptr, 0);
    return res >= 0;
}